

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_instance.cpp
# Opt level: O3

bool __thiscall
ON_InstanceDefinition::RemoveInstanceGeometryId(ON_InstanceDefinition *this,ON_UUID id)

{
  ON_UUID id_00;
  undefined8 uVar1;
  bool bVar2;
  uint i;
  ON_UUID_struct local_20;
  
  local_20.Data4 = id.Data4;
  local_20._0_8_ = id._0_8_;
  bVar2 = ::operator==(&ON_nil_uuid,&local_20);
  if ((((!bVar2) &&
       (id_00.Data4[0] = local_20.Data4[0], id_00.Data4[1] = local_20.Data4[1],
       id_00.Data4[2] = local_20.Data4[2], id_00.Data4[3] = local_20.Data4[3],
       id_00.Data4[4] = local_20.Data4[4], id_00.Data4[5] = local_20.Data4[5],
       id_00.Data4[6] = local_20.Data4[6], id_00.Data4[7] = local_20.Data4[7],
       id_00.Data1 = local_20.Data1, id_00.Data2 = local_20.Data2, id_00.Data3 = local_20.Data3,
       i = Internal_InstanceGeometryIdIndex(this,id_00), -1 < (int)i)) &&
      ((int)i < (this->m_object_uuid).m_count)) &&
     (bVar2 = ::operator==(&local_20,(this->m_object_uuid).m_a + i), bVar2)) {
    ON_SimpleArray<ON_UUID_struct>::Remove(&this->m_object_uuid,i);
    ON_ModelComponent::IncrementContentVersionNumber(&this->super_ON_ModelComponent);
    *(undefined4 *)((this->m_geometry_content_hash).m_digest + 0x10) =
         ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
    uVar1 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
    *(undefined8 *)(this->m_geometry_content_hash).m_digest =
         ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
    *(undefined8 *)((this->m_geometry_content_hash).m_digest + 8) = uVar1;
    uVar1 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
    *(undefined8 *)(this->m_content_hash).m_digest = ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
    *(undefined8 *)((this->m_content_hash).m_digest + 8) = uVar1;
    *(undefined4 *)((this->m_content_hash).m_digest + 0x10) =
         ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
    return true;
  }
  return false;
}

Assistant:

bool ON_InstanceDefinition::RemoveInstanceGeometryId(ON_UUID id)
{
  if (ON_nil_uuid == id)
    return false;
 int i = Internal_InstanceGeometryIdIndex(id);
 if ( i >= 0 && i < m_object_uuid.Count() && id == m_object_uuid[i])
 {
    m_object_uuid.Remove(i);
    Internal_ContentChanged();
    return true;
  }
  return false;
}